

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

void linker_relrefs(GlobalVars *gv)

{
  Section *pSVar1;
  char *pcVar2;
  long in_RDI;
  Reloc *reloc;
  Reloc *xref;
  Symbol *xdef;
  RelRef **rr;
  Symbol *r13init;
  Symbol *sda2base;
  Symbol *sdabase;
  Section *sec;
  ObjectUnit *obj;
  Section *in_stack_ffffffffffffffa8;
  Reloc *in_stack_ffffffffffffffb0;
  Section *sec_00;
  GlobalVars *in_stack_ffffffffffffffc0;
  int entrytype;
  ObjectUnit *ou;
  GlobalVars *gv_00;
  Symbol *local_28;
  Symbol *local_20;
  Section *local_18;
  long *local_10;
  
  local_20 = (Symbol *)0x0;
  local_28 = (Symbol *)0x0;
  gv_00 = (GlobalVars *)0x0;
  for (local_10 = *(long **)(in_RDI + 0x150); *local_10 != 0; local_10 = (long *)*local_10) {
    for (local_18 = (Section *)local_10[4]; (local_18->n).next != (node *)0x0;
        local_18 = (Section *)(local_18->n).next) {
      ou = (ObjectUnit *)&local_18->relrefs;
      *(RelRef **)ou = (RelRef *)0x0;
      for (sec_00 = (Section *)(local_18->xrefs).first; (sec_00->n).next != (node *)0x0;
          sec_00 = (Section *)(sec_00->n).next) {
        set_last_sec_reloc(local_18,(Reloc *)sec_00);
        in_stack_ffffffffffffffc0 =
             (GlobalVars *)((anon_union_8_4_462a49d9_for_relocsect *)&sec_00->lnksec)->symbol;
        if (((in_stack_ffffffffffffffc0 != (GlobalVars *)0x0) &&
            ((Section *)(in_stack_ffffffffffffffc0->flavours).flavours != (Section *)0x0)) &&
           ((*(uint8_t *)&(in_stack_ffffffffffffffc0->flavours).flavour_dir == '\x02' ||
            (*(uint8_t *)&(in_stack_ffffffffffffffc0->flavours).flavour_dir == '\x03')))) {
          if ((((*(uint8_t *)&sec_00->va == '\n') || (*(uint8_t *)&sec_00->va == '!')) ||
              (*(uint8_t *)&sec_00->va == '\"')) &&
             (*(uint8_t *)&(in_stack_ffffffffffffffc0->flavours).flavour_dir == '\x03')) {
            pSVar1 = scommon_section(gv_00,ou);
            (in_stack_ffffffffffffffc0->flavours).flavours = (char **)pSVar1;
          }
          if ((*(char *)&sec_00->va == '\x02') &&
             ((Section *)(in_stack_ffffffffffffffc0->flavours).flavours != local_18)) {
            addrelref((RelRef **)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          }
          else if (((*(char *)&sec_00->va == '\n') || (*(char *)&sec_00->va == '\"')) &&
                  ((pSVar1 = (Section *)(in_stack_ffffffffffffffc0->flavours).flavours,
                   pSVar1->flags = pSVar1->flags | 4, *(int *)(in_RDI + 0x90) == 0 &&
                   (((Section *)(in_stack_ffffffffffffffc0->flavours).flavours)->type == '\x01'))))
          {
            pcVar2 = getobjname((ObjectUnit *)sec_00);
            error(0x79,pcVar2,local_18->name,((list *)&sec_00->name)->first);
          }
        }
      }
      for (in_stack_ffffffffffffffb0 = (Reloc *)(local_18->relocs).first;
          (in_stack_ffffffffffffffb0->n).next != (node *)0x0;
          in_stack_ffffffffffffffb0 = (Reloc *)(in_stack_ffffffffffffffb0->n).next) {
        set_last_sec_reloc(local_18,in_stack_ffffffffffffffb0);
        if ((in_stack_ffffffffffffffb0->rtype == '\x02') &&
           ((in_stack_ffffffffffffffb0->relocsect).ptr != local_18)) {
          addrelref((RelRef **)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        }
        else {
          entrytype = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
          if ((in_stack_ffffffffffffffb0->rtype == '\x03') ||
             (in_stack_ffffffffffffffb0->rtype == '\x04')) {
            dyn_reloc_entry(gv_00,(Reloc *)ou,entrytype);
          }
          else if ((in_stack_ffffffffffffffb0->rtype == '\a') ||
                  (in_stack_ffffffffffffffb0->rtype == '\b')) {
            dyn_reloc_entry(gv_00,(Reloc *)ou,entrytype);
          }
          else if (in_stack_ffffffffffffffb0->rtype == '\n') {
            ((in_stack_ffffffffffffffb0->relocsect).ptr)->flags =
                 ((in_stack_ffffffffffffffb0->relocsect).ptr)->flags | 4;
            if ((local_20 == (Symbol *)0x0) &&
               (local_20 = find_any_symbol(in_stack_ffffffffffffffc0,sec_00,
                                           (char *)in_stack_ffffffffffffffb0),
               local_20 != (Symbol *)0x0)) {
              local_20->flags = local_20->flags | 2;
            }
            if ((*(int *)(in_RDI + 0x90) == 0) &&
               (((in_stack_ffffffffffffffb0->relocsect).ptr)->type == '\x01')) {
              pcVar2 = getobjname((ObjectUnit *)sec_00);
              error(0x79,pcVar2,local_18->name,in_stack_ffffffffffffffb0->offset);
            }
          }
          else if (in_stack_ffffffffffffffb0->rtype == ' ') {
            if ((local_28 == (Symbol *)0x0) &&
               (local_28 = find_any_symbol(in_stack_ffffffffffffffc0,sec_00,
                                           (char *)in_stack_ffffffffffffffb0),
               local_28 != (Symbol *)0x0)) {
              local_28->flags = local_28->flags | 2;
            }
          }
          else if (in_stack_ffffffffffffffb0->rtype == '\"') {
            ((in_stack_ffffffffffffffb0->relocsect).ptr)->flags =
                 ((in_stack_ffffffffffffffb0->relocsect).ptr)->flags | 4;
            if ((gv_00 == (GlobalVars *)0x0) &&
               (gv_00 = (GlobalVars *)
                        find_any_symbol(in_stack_ffffffffffffffc0,sec_00,
                                        (char *)in_stack_ffffffffffffffb0),
               gv_00 != (GlobalVars *)0x0)) {
              *(byte *)((long)&(gv_00->flavours).flavour_dir + 1) =
                   *(uint8_t *)((long)&(gv_00->flavours).flavour_dir + 1) | 2;
            }
            if ((*(int *)(in_RDI + 0x90) == 0) &&
               (((in_stack_ffffffffffffffb0->relocsect).ptr)->type == '\x01')) {
              pcVar2 = getobjname((ObjectUnit *)sec_00);
              error(0x79,pcVar2,local_18->name,in_stack_ffffffffffffffb0->offset);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void linker_relrefs(struct GlobalVars *gv)
/* All relocations and unresolved xrefs with a relative reference
   to other sections are collected. A second task is to detect
   and handle base-relative and GOT/PLT references. */
{
  struct ObjectUnit *obj;
  struct Section *sec;
  struct Symbol *sdabase = NULL;
  struct Symbol *sda2base = NULL;
  struct Symbol *r13init = NULL;

  for (obj=(struct ObjectUnit *)gv->selobjects.first;
       obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {

    for (sec=(struct Section *)obj->sections.first;
         sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
      struct RelRef **rr = &sec->relrefs;
      struct Symbol *xdef;
      struct Reloc *xref,*reloc;

      for (*rr=NULL,xref=(struct Reloc *)sec->xrefs.first;
           xref->n.next!=NULL; xref=(struct Reloc *)xref->n.next) {

        /* remember offset of sections's last xref */
        set_last_sec_reloc(sec,xref);

        if (xdef = xref->relocsect.symbol) {
          if (xdef->relsect!=NULL &&
              (xdef->type==SYM_RELOC || xdef->type==SYM_COMMON)) {

            if ((xref->rtype==R_SD || xref->rtype==R_SD21 ||
                 xref->rtype==R_MOSDREL) && xdef->type==SYM_COMMON) {
                /* small data common symbol - assign .scommon section */
                xdef->relsect = scommon_section(gv,xdef->relsect->obj);
            }

            if (xref->rtype==R_PC && xdef->relsect!=sec) {
              /* relative reference to different section */
              addrelref(rr,xdef->relsect);
            }

            else if (xref->rtype==R_SD || xref->rtype==R_MOSDREL) {
              /* other section is accessed base relative from this one */
              xdef->relsect->flags |= SF_SMALLDATA;
              if (!gv->textbaserel && xdef->relsect->type==ST_CODE)
                error(121,getobjname(sec->obj),sec->name,xref->offset);
            }
          }
        }
      }

      for (reloc=(struct Reloc *)sec->relocs.first;
           reloc->n.next!=NULL; reloc=(struct Reloc *)reloc->n.next) {

        /* remember offset of sections's last reloc */
        set_last_sec_reloc(sec,reloc);

        if (reloc->rtype==R_PC && reloc->relocsect.ptr!=sec) {
          /* relative reference to different section */
          addrelref(rr,reloc->relocsect.ptr);
        }

        else if (reloc->rtype==R_GOT || reloc->rtype==R_GOTPC) {
          /* a local relocation to a GOT entry may create that entry */
          dyn_reloc_entry(gv,reloc,GOT_LOCAL);
        }

        else if (reloc->rtype==R_PLT || reloc->rtype==R_PLTPC) {
          /* a local relocation to a PLT entry may create that entry */
          dyn_reloc_entry(gv,reloc,PLT_LOCAL);
        }

        else if (reloc->rtype == R_SD) {
          /* other section is accessed base relative from this one */
          reloc->relocsect.ptr->flags |= SF_SMALLDATA;
          if (!sdabase) {
            /* R_SD relocation implies a reference to _SDA_BASE_ */
            if (sdabase = find_any_symbol(gv,sec,sdabase_name))
              sdabase->flags |= SYMF_REFERENCED;
          }
          if (!gv->textbaserel && reloc->relocsect.ptr->type==ST_CODE)
            error(121,getobjname(sec->obj),sec->name,reloc->offset);
        }

        else if (reloc->rtype == R_SD2) {
          if (!sda2base) {
            /* R_SD2 relocation implies a reference to _SDA2_BASE_ */
            if (sda2base = find_any_symbol(gv,sec,sda2base_name))
              sda2base->flags |= SYMF_REFERENCED;
          }
        }

        else if (reloc->rtype == R_MOSDREL) {
          /* other section is accessed base relative from this one */
          reloc->relocsect.ptr->flags |= SF_SMALLDATA;
          if (!r13init) {
            /* R_MOSDREL relocation implies a reference to __r13_init */
            if (r13init = find_any_symbol(gv,sec,r13init_name))
              r13init->flags |= SYMF_REFERENCED;
          }
          if (!gv->textbaserel && reloc->relocsect.ptr->type==ST_CODE)
            error(121,getobjname(sec->obj),sec->name,reloc->offset);
        }

      }
    }
  }
}